

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
::rehash(hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
  *phVar2;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 in_ESI;
  vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
  *in_RDI;
  node *pNode_end;
  node *pNode;
  hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
  new_map;
  hash_map_type *in_stack_ffffffffffffff78;
  hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
  *in_stack_ffffffffffffff80;
  hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
  *this_00;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  node *pNode_00;
  undefined4 in_stack_ffffffffffffffa0;
  hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
  *local_48;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_20;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_18;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_14;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_c;
  
  if ((in_RDI[1].m_size <= in_ESI.m_u32) &&
     (local_c = in_ESI,
     uVar1 = vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
             ::size(in_RDI), in_ESI.m_u32 != uVar1)) {
    pNode_00 = (node *)&stack0xffffffffffffffd0;
    hash_map(in_stack_ffffffffffffff80);
    vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
    ::resize((vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
              *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    uVar1 = math::floor_log2i(local_c.m_u32);
    local_20.m_u32 = 0x20 - uVar1;
    local_14.m_u32 = 0xffffffff;
    local_48 = (hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
                *)vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
                  ::begin(in_RDI);
    this_00 = local_48;
    uVar1 = vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
            ::size(in_RDI);
    phVar2 = (hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
              *)((long)this_00 + (ulong)uVar1 * 0x44);
    while ((local_48 != phVar2 &&
           ((*(uint8 *)((long)&local_48[2].m_values.m_p + 1) == '\0' ||
            (move_into((hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
                        *)CONCAT44(in_ESI.m_u32,in_stack_ffffffffffffffa0),pNode_00),
            local_18.m_u32 != in_RDI[1].m_size))))) {
      local_48 = (hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
                  *)((long)&local_48[2].m_values.m_p + 4);
    }
    local_14.m_u32 = local_c.m_u32 + 1 >> 1;
    vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
    ::clear_no_destruction(&this_00->m_values);
    *(undefined4 *)&in_RDI[1].m_p = 0x20;
    swap(this_00,in_stack_ffffffffffffff78);
    ~hash_map(this_00);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }